

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void __thiscall HighsHashTree<int,_void>::InnerLeaf<4>::rehash(InnerLeaf<4> *this,int hashPos)

{
  int iVar1;
  ulong uVar2;
  uint8_t pos_00;
  uint16_t uVar3;
  reference pvVar4;
  uint64_t hash_00;
  reference pvVar5;
  int in_ESI;
  Occupation *in_RDI;
  type entry;
  uint64_t hash;
  int pos;
  uint8_t hashChunk;
  int i;
  int i_1;
  undefined7 in_stack_ffffffffffffff88;
  uint8_t in_stack_ffffffffffffff8f;
  array<unsigned_long,_55UL> *in_stack_ffffffffffffff90;
  array<unsigned_long,_55UL> *this_00;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar6;
  reference in_stack_ffffffffffffffa8;
  InnerLeaf<4> *in_stack_ffffffffffffffb0;
  int local_28;
  int local_20;
  int local_1c;
  Occupation local_18;
  int local_c;
  
  local_c = in_ESI;
  Occupation::Occupation(&local_18,0);
  in_RDI->occupation = local_18.occupation;
  for (local_1c = 0; local_1c < (int)in_RDI[1].occupation; local_1c = local_1c + 1) {
    pvVar4 = std::array<HighsHashTableEntry<int,_void>,_54UL>::operator[]
                       ((array<HighsHashTableEntry<int,_void>,_54UL> *)in_stack_ffffffffffffff90,
                        CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    HighsHashTableEntry<int,_void>::key(pvVar4);
    hash_00 = compute_hash((int *)0x5715a2);
    uVar3 = get_hash_chunks16(hash_00,local_c);
    pvVar5 = std::array<unsigned_long,_55UL>::operator[]
                       (in_stack_ffffffffffffff90,
                        CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    *pvVar5 = (ulong)uVar3;
    pvVar5 = std::array<unsigned_long,_55UL>::operator[]
                       (in_stack_ffffffffffffff90,
                        CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    pos_00 = get_first_chunk16((uint16_t)*pvVar5);
    Occupation::set(in_RDI,pos_00);
  }
  local_20 = 0;
  while (local_20 < (int)in_RDI[1].occupation) {
    pvVar5 = std::array<unsigned_long,_55UL>::operator[]
                       (in_stack_ffffffffffffff90,
                        CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    get_first_chunk16((uint16_t)*pvVar5);
    local_28 = Occupation::num_set_until
                         ((Occupation *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
    local_28 = local_28 + -1;
    this_00 = in_stack_ffffffffffffff90;
    if (local_20 < local_28) {
      in_stack_ffffffffffffffa8 =
           std::array<unsigned_long,_55UL>::operator[]
                     (in_stack_ffffffffffffff90,
                      CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      pvVar5 = std::array<unsigned_long,_55UL>::operator[]
                         (in_stack_ffffffffffffff90,
                          CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      std::swap<unsigned_long>(in_stack_ffffffffffffffa8,pvVar5);
      in_stack_ffffffffffffffb0 =
           (InnerLeaf<4> *)
           std::array<HighsHashTableEntry<int,_void>,_54UL>::operator[]
                     ((array<HighsHashTableEntry<int,_void>,_54UL> *)in_stack_ffffffffffffff90,
                      CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      pvVar4 = std::array<HighsHashTableEntry<int,_void>,_54UL>::operator[]
                         ((array<HighsHashTableEntry<int,_void>,_54UL> *)in_stack_ffffffffffffff90,
                          CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      std::swap<HighsHashTableEntry<int,void>>
                ((HighsHashTableEntry<int,_void> *)in_stack_ffffffffffffffb0,pvVar4);
    }
    else {
      while( true ) {
        uVar6 = false;
        if (local_28 < local_20) {
          pvVar5 = std::array<unsigned_long,_55UL>::operator[]
                             (this_00,CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88))
          ;
          uVar2 = *pvVar5;
          pvVar5 = std::array<unsigned_long,_55UL>::operator[]
                             (this_00,CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88))
          ;
          uVar6 = *pvVar5 <= uVar2;
        }
        if ((bool)uVar6 == false) break;
        local_28 = local_28 + 1;
      }
      in_stack_ffffffffffffff90 = this_00;
      if (local_28 < local_20) {
        pvVar5 = std::array<unsigned_long,_55UL>::operator[]
                           (this_00,CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
        in_stack_ffffffffffffff90 = (array<unsigned_long,_55UL> *)*pvVar5;
        pvVar4 = std::array<HighsHashTableEntry<int,_void>,_54UL>::operator[]
                           ((array<HighsHashTableEntry<int,_void>,_54UL> *)this_00,
                            CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
        iVar1 = pvVar4->value_;
        move_backward(in_stack_ffffffffffffffb0,(int *)in_stack_ffffffffffffffa8,
                      (int *)CONCAT17(uVar6,in_stack_ffffffffffffffa0));
        pvVar5 = std::array<unsigned_long,_55UL>::operator[]
                           (in_stack_ffffffffffffff90,
                            CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
        *pvVar5 = (value_type_conflict6)in_stack_ffffffffffffff90;
        pvVar4 = std::array<HighsHashTableEntry<int,_void>,_54UL>::operator[]
                           ((array<HighsHashTableEntry<int,_void>,_54UL> *)in_stack_ffffffffffffff90
                            ,CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
        pvVar4->value_ = iVar1;
      }
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

void rehash(int hashPos) {
      // function needs to possibly reorder elements by a different hash value
      // chances are very high we are already ordered correctly as we use 16
      // bits of the hash and one level is uses 6 bits, so the new values
      // are guaranteed to be ordered correctly by their 10 most significant
      // bits if increasing the hash position by 1 and only if the 10 bits of
      // the hash had a collision the new 6 bits might break a tie differently.
      // It is, however, important to maintain the exact ordering as otherwise
      // elements may not be found.
      occupation = 0;
      for (int i = 0; i < size; ++i) {
        hashes[i] = get_hash_chunks16(compute_hash(entries[i].key()), hashPos);
        occupation.set(get_first_chunk16(hashes[i]));
      }

      int i = 0;
      while (i < size) {
        uint8_t hashChunk = get_first_chunk16(hashes[i]);
        int pos = occupation.num_set_until(hashChunk) - 1;

        // if the position is after i the element definitely comes later, so we
        // swap it to that position and proceed without increasing i until
        // eventually an element appears that comes at position i or before
        if (pos > i) {
          std::swap(hashes[pos], hashes[i]);
          std::swap(entries[pos], entries[i]);
          continue;
        }

        // the position is before or at i, now check where the exact location
        // should be for the ordering by hash so that the invariant is that all
        // elements up to i are properly sorted. Essentially insertion sort but
        // with the modification of having a high chance to guess the correct
        // position already using the occupation flags.
        while (pos < i && hashes[pos] >= hashes[i]) ++pos;

        // if the final position is before i we need to move elements to
        // make space at that position, otherwise nothing needs to be done but
        // incrementing i increasing the sorted range by 1.
        if (pos < i) {
          uint64_t hash = hashes[i];
          auto entry = std::move(entries[i]);
          move_backward(pos, i);
          hashes[pos] = hash;
          entries[pos] = std::move(entry);
        }
        ++i;
      }
    }